

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-tree.c
# Opt level: O3

coda_tree_node * coda_tree_node_new(coda_type *root_type)

{
  coda_tree_node *pcVar1;
  
  pcVar1 = (coda_tree_node *)malloc(0x38);
  if (pcVar1 == (coda_tree_node *)0x0) {
    coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",0x38,
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-tree.c"
                   ,0x35);
  }
  else {
    pcVar1->type = root_type;
    pcVar1->num_items = 0;
    pcVar1->item = (void **)0x0;
    pcVar1->all_children = (coda_tree_node *)0x0;
    pcVar1->num_indexed_children = 0;
    pcVar1->index = (long *)0x0;
    pcVar1->indexed_child = (coda_tree_node **)0x0;
  }
  return pcVar1;
}

Assistant:

coda_tree_node *coda_tree_node_new(const coda_type *root_type)
{
    coda_tree_node *node;

    node = malloc(sizeof(coda_tree_node));
    if (node == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                       (long)sizeof(coda_tree_node), __FILE__, __LINE__);
        return NULL;
    }
    node->type = root_type;
    node->num_items = 0;
    node->item = NULL;
    node->all_children = NULL;
    node->num_indexed_children = 0;
    node->index = NULL;
    node->indexed_child = NULL;

    return node;
}